

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall
pugi::xml_node::find_child_by_attribute
          (xml_node *this,char_t *name_,char_t *attr_name,char_t *attr_value)

{
  xml_node_struct *p;
  xml_attribute_struct *pxVar1;
  bool bVar2;
  xml_node_struct *in_RAX;
  xml_node_struct **ppxVar3;
  xml_attribute_struct **ppxVar4;
  char_t *dst;
  xml_node local_38;
  
  local_38._root = in_RAX;
  if (this->_root != (xml_node_struct *)0x0) {
    ppxVar3 = &this->_root->first_child;
    while (p = *ppxVar3, p != (xml_node_struct *)0x0) {
      if ((p->name != (char_t *)0x0) &&
         (bVar2 = impl::anon_unknown_0::strequal(name_,p->name), bVar2)) {
        ppxVar4 = &p->first_attribute;
        while (pxVar1 = *ppxVar4, pxVar1 != (xml_attribute_struct *)0x0) {
          if ((pxVar1->name != (char_t *)0x0) &&
             (bVar2 = impl::anon_unknown_0::strequal(attr_name,pxVar1->name), bVar2)) {
            dst = pxVar1->value;
            if (dst == (char_t *)0x0) {
              dst = "";
            }
            bVar2 = impl::anon_unknown_0::strequal(attr_value,dst);
            if (bVar2) {
              xml_node(&local_38,p);
              return (xml_node)local_38._root;
            }
          }
          ppxVar4 = &pxVar1->next_attribute;
        }
      }
      ppxVar3 = &p->next_sibling;
    }
  }
  xml_node(&local_38);
  return (xml_node)local_38._root;
}

Assistant:

PUGI__FN xml_node xml_node::find_child_by_attribute(const char_t* name_, const char_t* attr_name, const char_t* attr_value) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			if (i->name && impl::strequal(name_, i->name))
			{
				for (xml_attribute_struct* a = i->first_attribute; a; a = a->next_attribute)
					if (a->name && impl::strequal(attr_name, a->name) && impl::strequal(attr_value, a->value ? a->value + 0 : PUGIXML_TEXT("")))
						return xml_node(i);
			}

		return xml_node();
	}